

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

GLFWwindow * __thiscall
embree::TutorialApplication::createFullScreenWindow(TutorialApplication *this)

{
  GLFWvidmode *pGVar1;
  GLFWwindow *pGVar2;
  GLFWwindow *window;
  GLFWvidmode *mode;
  GLFWmonitor *monitor;
  GLFWwindow *in_stack_00000390;
  GLFWmonitor *in_stack_00000398;
  char *in_stack_000003a0;
  int in_stack_000003a8;
  int in_stack_000003ac;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int iVar3;
  int in_stack_ffffffffffffffd4;
  int iVar4;
  
  glfwGetPrimaryMonitor();
  pGVar1 = glfwGetVideoMode((GLFWmonitor *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  glfwWindowHint(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  glfwWindowHint(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  glfwWindowHint(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  glfwWindowHint(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  iVar3 = pGVar1->width;
  iVar4 = pGVar1->height;
  std::__cxx11::string::c_str();
  pGVar2 = glfwCreateWindow(in_stack_000003ac,in_stack_000003a8,in_stack_000003a0,in_stack_00000398,
                            in_stack_00000390);
  resize((TutorialApplication *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffcc,
         in_stack_ffffffffffffffc8);
  return pGVar2;
}

Assistant:

GLFWwindow* TutorialApplication::createFullScreenWindow()
  {
    GLFWmonitor* monitor = glfwGetPrimaryMonitor();
    const GLFWvidmode* mode = glfwGetVideoMode(monitor);
    glfwWindowHint(GLFW_RED_BITS,mode->redBits);
    glfwWindowHint(GLFW_GREEN_BITS,mode->greenBits);
    glfwWindowHint(GLFW_BLUE_BITS,mode->blueBits);
    glfwWindowHint(GLFW_REFRESH_RATE,mode->refreshRate);
    GLFWwindow* window = glfwCreateWindow(mode->width,mode->height,tutorialName.c_str(),monitor,nullptr);
    resize(mode->width,mode->height);
    return window;
  }